

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O2

void __thiscall cfd::core::AbstractTxIn::AbstractTxIn(AbstractTxIn *this,AbstractTxIn *param_1)

{
  this->_vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_00787d08;
  Txid::Txid(&this->txid_,&param_1->txid_);
  this->vout_ = param_1->vout_;
  Script::Script(&this->unlocking_script_,&param_1->unlocking_script_);
  this->sequence_ = param_1->sequence_;
  ScriptWitness::ScriptWitness(&this->script_witness_,&param_1->script_witness_);
  return;
}

Assistant:

class CFD_CORE_EXPORT AbstractTxIn {
 public:
  /**
   * @brief constructor.
   * @param[in] txid        txid
   * @param[in] index       TxOut Index information for txid transactions(vout)
   * @param[in] sequence    sequence
   */
  AbstractTxIn(const Txid& txid, uint32_t index, uint32_t sequence);
  /**
   * @brief constructor.
   * @param[in] txid              txid
   * @param[in] index             TxOut Index information for txid transactions(vout)
   * @param[in] sequence          sequence
   * @param[in] unlocking_script  unlocking script
   */
  AbstractTxIn(
      const Txid& txid, uint32_t index, uint32_t sequence,
      const Script& unlocking_script);
  /**
   * @brief destructor
   */
  virtual ~AbstractTxIn() {
    // do nothing
  }
  /**
   * @brief Get a txid.
   * @return Txid
   */
  Txid GetTxid() const;
  /**
   * @brief Get a vout.
   * @return vout
   */
  uint32_t GetVout() const;
  /**
   * @brief Get an outpoint.
   * @return outpoint
   */
  OutPoint GetOutPoint() const;
  /**
   * @brief Get an unlocking script.
   * @return unlocking script
   */
  Script GetUnlockingScript() const;
  /**
   * @brief Set an unlocking script.
   * @param[in] unlocking_script    unlocking script
   */
  void SetUnlockingScript(const Script& unlocking_script);
  /**
   * @brief Get a sequence.
   * @return sequence番号
   */
  uint32_t GetSequence() const;
  /**
   * @brief Set a sequence number.
   * @param[in] sequence    sequence number
   */
  void SetSequence(uint32_t sequence);
  /**
   * @brief Get a script witness.
   * @return ScriptWitness
   */
  ScriptWitness GetScriptWitness() const;
  /**
   * @brief Get the current stack number of script witness.
   * @return number of script witness.
   */
  uint32_t GetScriptWitnessStackNum() const;
  /**
   * @brief Add byte data to script witness.
   * @param[in] data    witness stack
   * @return ScriptWitness object
   */
  ScriptWitness AddScriptWitnessStack(const ByteData& data);
  /**
   * @brief Set byte data in script witness.
   * @param[in] index   witness stack index
   * @param[in] data    witness stack data
   * @return ScriptWitness object
   */
  ScriptWitness SetScriptWitnessStack(uint32_t index, const ByteData& data);
  /**
   * @brief Remove all script witness.
   */
  void RemoveScriptWitnessStackAll();

  /**
   * @brief Determine coinbase by txid / vout.
   * @retval true  coinbase
   * @retval false other
   */
  bool IsCoinBase() const;

 protected:
  Txid txid_;                     ///< txid
  uint32_t vout_;                 ///< vout
  Script unlocking_script_;       ///< unlocking script
  uint32_t sequence_;             ///< sequence no
  ScriptWitness script_witness_;  ///< script witness.
}